

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O3

void __thiscall
gss::innards::HomomorphismSearcher::propagate_adjacency_constraints<true,true,true,false>
          (HomomorphismSearcher *this,HomomorphismDomain *d,
          HomomorphismAssignment *current_assignment)

{
  ulong uVar1;
  int iVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  SVOBitset *pSVar6;
  int iVar7;
  undefined8 uVar8;
  int iVar9;
  ulong uVar10;
  HomomorphismModel *this_00;
  uint g;
  ulong uVar11;
  SVOBitset check_d_values;
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  bVar3 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,current_assignment->pattern_vertex,d->v);
  if ((bVar3 & 1) == 0) {
    pSVar6 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar6);
  }
  else {
    pSVar6 = HomomorphismModel::forward_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar6);
  }
  bVar4 = HomomorphismModel::pattern_adjacency_bits
                    (this->model,d->v,current_assignment->pattern_vertex);
  if ((bVar4 & 1) == 0) {
    pSVar6 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::intersect_with_complement(&d->values,pSVar6);
  }
  else {
    pSVar6 = HomomorphismModel::reverse_target_graph_row
                       (this->model,current_assignment->target_vertex);
    SVOBitset::operator&=(&d->values,pSVar6);
  }
  this_00 = this->model;
  if (1 < this_00->max_graphs) {
    g = 1;
    do {
      if ((bVar3 >> (g & 0x1f) & 1) != 0) {
        pSVar6 = HomomorphismModel::target_graph_row(this_00,g,current_assignment->target_vertex);
        SVOBitset::operator&=(&d->values,pSVar6);
        this_00 = this->model;
      }
      g = g + 1;
    } while (g < this_00->max_graphs);
  }
  if ((bVar3 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)&local_b8,&d->values);
    iVar5 = HomomorphismModel::pattern_edge_label
                      (this->model,current_assignment->pattern_vertex,d->v);
    uVar11 = (ulong)local_38;
    uVar8 = &local_b8;
    if (0x10 < uVar11) {
      uVar8 = local_b8.short_data[0];
    }
    if (uVar11 != 0) {
      iVar9 = 0;
      uVar10 = 0;
LAB_001388dc:
      uVar1 = *(ulong *)(uVar8 + uVar10 * 8);
      if (uVar1 == 0) goto code_r0x001388e5;
      iVar7 = 0;
      for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar7 = iVar7 + 1;
      }
      if (iVar7 + 1 == iVar9) {
LAB_00138902:
        if ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
            (anon_union_128_2_84168a9f_for__data *)0x0 && 0x10 < local_38) {
          operator_delete__(local_b8.long_data);
        }
        goto LAB_00138917;
      }
      iVar7 = iVar7 - iVar9;
      while( true ) {
        uVar8 = local_b8.long_data;
        if ((uint)uVar11 < 0x11) {
          uVar8 = &local_b8;
        }
        bVar3 = (byte)iVar7 & 0x3f;
        uVar11 = -2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3;
        iVar9 = iVar7 + 0x3f;
        if (-1 < iVar7) {
          iVar9 = iVar7;
        }
        *(ulong *)(uVar8 + (long)(iVar9 >> 6) * 8) =
             *(ulong *)(uVar8 + (long)(iVar9 >> 6) * 8) & uVar11;
        iVar7 = HomomorphismModel::target_edge_label
                          (this->model,current_assignment->target_vertex,iVar7);
        if (iVar7 != iVar5) {
          pSVar6 = &d->values;
          if (0x10 < (d->values).n_words) {
            pSVar6 = (SVOBitset *)(d->values)._data.short_data[0];
          }
          (pSVar6->_data).short_data[iVar9 >> 6] = (pSVar6->_data).short_data[iVar9 >> 6] & uVar11;
        }
        uVar11 = (ulong)local_38;
        uVar8 = &local_b8;
        if (0x10 < uVar11) {
          uVar8 = local_b8.long_data;
        }
        if (uVar11 == 0) break;
        iVar9 = 0;
        uVar10 = 0;
        while (uVar1 = *(ulong *)(uVar8 + uVar10 * 8), uVar1 == 0) {
          uVar10 = uVar10 + 1;
          iVar9 = iVar9 + -0x40;
          if (uVar11 == uVar10) goto LAB_00138902;
        }
        iVar2 = 0;
        for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
          iVar2 = iVar2 + 1;
        }
        iVar7 = iVar2 - iVar9;
        if (iVar2 + 1 == iVar9) goto LAB_00138902;
      }
    }
LAB_00138917:
    this_00 = this->model;
  }
  bVar3 = HomomorphismModel::pattern_adjacency_bits(this_00,d->v,current_assignment->pattern_vertex)
  ;
  if ((bVar3 & 1) != 0) {
    SVOBitset::SVOBitset((SVOBitset *)&local_b8,&d->values);
    iVar5 = HomomorphismModel::pattern_edge_label
                      (this->model,d->v,current_assignment->pattern_vertex);
    uVar11 = (ulong)local_38;
    uVar8 = &local_b8;
    if (0x10 < uVar11) {
      uVar8 = local_b8.short_data[0];
    }
    if (uVar11 != 0) {
      iVar9 = 0;
      uVar10 = 0;
      while (uVar1 = *(ulong *)(uVar8 + uVar10 * 8), uVar1 == 0) {
        uVar10 = uVar10 + 1;
        iVar9 = iVar9 + -0x40;
        if (uVar11 == uVar10) goto LAB_00138992;
      }
      iVar7 = 0;
      for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
        iVar7 = iVar7 + 1;
      }
      if (iVar7 + 1 != iVar9) {
        iVar7 = iVar7 - iVar9;
        do {
          uVar8 = local_b8.long_data;
          if ((uint)uVar11 < 0x11) {
            uVar8 = &local_b8;
          }
          bVar3 = (byte)iVar7 & 0x3f;
          uVar11 = -2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3;
          iVar9 = iVar7 + 0x3f;
          if (-1 < iVar7) {
            iVar9 = iVar7;
          }
          *(ulong *)(uVar8 + (long)(iVar9 >> 6) * 8) =
               *(ulong *)(uVar8 + (long)(iVar9 >> 6) * 8) & uVar11;
          iVar7 = HomomorphismModel::target_edge_label
                            (this->model,iVar7,current_assignment->target_vertex);
          if (iVar7 != iVar5) {
            pSVar6 = &d->values;
            if (0x10 < (d->values).n_words) {
              pSVar6 = (SVOBitset *)(d->values)._data.short_data[0];
            }
            (pSVar6->_data).short_data[iVar9 >> 6] = (pSVar6->_data).short_data[iVar9 >> 6] & uVar11
            ;
          }
          uVar11 = (ulong)local_38;
          uVar8 = &local_b8;
          if (0x10 < uVar11) {
            uVar8 = local_b8.long_data;
          }
          if (uVar11 == 0) {
            return;
          }
          iVar9 = 0;
          uVar10 = 0;
          while (uVar1 = *(ulong *)(uVar8 + uVar10 * 8), uVar1 == 0) {
            uVar10 = uVar10 + 1;
            iVar9 = iVar9 + -0x40;
            if (uVar11 == uVar10) goto LAB_00138992;
          }
          iVar2 = 0;
          for (; (uVar1 & 1) == 0; uVar1 = uVar1 >> 1 | 0x8000000000000000) {
            iVar2 = iVar2 + 1;
          }
          iVar7 = iVar2 - iVar9;
        } while (iVar2 + 1 != iVar9);
      }
LAB_00138992:
      if ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
          (anon_union_128_2_84168a9f_for__data *)0x0 && 0x10 < local_38) {
        operator_delete__(local_b8.long_data);
      }
    }
  }
  return;
code_r0x001388e5:
  uVar10 = uVar10 + 1;
  iVar9 = iVar9 + -0x40;
  if (uVar11 == uVar10) goto LAB_00138902;
  goto LAB_001388dc;
}

Assistant:

auto HomomorphismSearcher::propagate_adjacency_constraints(HomomorphismDomain & d, const HomomorphismAssignment & current_assignment) -> void
{
    const auto & graph_pairs_to_consider = model.pattern_adjacency_bits(current_assignment.pattern_vertex, d.v);

    [[maybe_unused]] conditional_t<verbose_proofs_, SVOBitset, tuple<>> before;
    if constexpr (verbose_proofs_) {
        before = d.values;
    }

    if constexpr (! directed_) {
        // for the original graph pair, if we're adjacent...
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(0, current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.target_graph_row(0, current_assignment.target_vertex));
            }
        }
    }
    else {
        // both forward and reverse edges to consider
        if (graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.forward_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.forward_target_graph_row(current_assignment.target_vertex));
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);

        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.reverse_target_graph_row(current_assignment.target_vertex);
        }
        else {
            if constexpr (induced_) {
                // ...otherwise we can only be mapped to adjacent vertices
                d.values.intersect_with_complement(model.reverse_target_graph_row(current_assignment.target_vertex));
            }
        }
    }

    if constexpr (verbose_proofs_) {
        if (before.count() != d.values.count())
            proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                0, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
        before = d.values;
    }

    // and for each remaining graph pair...
    for (unsigned g = 1; g < model.max_graphs; ++g) {
        // if we're adjacent...
        if (graph_pairs_to_consider & (1u << g)) {
            // ...then we can only be mapped to adjacent vertices
            d.values &= model.target_graph_row(g, current_assignment.target_vertex);
        }

        if constexpr (verbose_proofs_) {
            if (before.count() != d.values.count())
                proof->propagated(model.pattern_vertex_for_proof(current_assignment.pattern_vertex), model.target_vertex_for_proof(current_assignment.target_vertex),
                    g, before.count() - d.values.count(), model.pattern_vertex_for_proof(d.v));
            before = d.values;
        }
    }

    if constexpr (has_edge_labels_) {
        // if we're adjacent in the original graph, additionally the edge labels need to match up
        if (graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_forward_label = model.pattern_edge_label(current_assignment.pattern_vertex, d.v);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_forward_label = model.target_edge_label(current_assignment.target_vertex, c);
                if (got_forward_label != want_forward_label)
                    d.values.reset(c);
            }
        }

        const auto & reverse_edge_graph_pairs_to_consider = model.pattern_adjacency_bits(d.v, current_assignment.pattern_vertex);
        if (reverse_edge_graph_pairs_to_consider & (1u << 0)) {
            auto check_d_values = d.values;

            auto want_reverse_label = model.pattern_edge_label(d.v, current_assignment.pattern_vertex);
            for (auto c = check_d_values.find_first(); c != decltype(check_d_values)::npos; c = check_d_values.find_first()) {
                check_d_values.reset(c);

                auto got_reverse_label = model.target_edge_label(c, current_assignment.target_vertex);
                if (got_reverse_label != want_reverse_label)
                    d.values.reset(c);
            }
        }
    }
}